

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

bool __thiscall llvm::DWARFUnit::parseDWO(DWARFUnit *this)

{
  DIContextKind *pDVar1;
  uint *puVar2;
  DwarfFormat Format;
  char cVar3;
  uint32_t uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *__n;
  undefined1 auVar5 [8];
  bool bVar6;
  int iVar7;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 Str;
  element_type *peVar8;
  undefined4 extraout_var;
  raw_ostream *prVar9;
  size_t __n_00;
  uint64_t uVar10;
  byte bVar11;
  Error *E;
  void *__buf;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar12;
  DWARFUnit *__tmp;
  DWARFUnit *pDVar13;
  StringRef AbsolutePath_00;
  StringRef Str_00;
  Optional<const_char_*> OVar14;
  Optional<const_char_*> OVar15;
  Optional<unsigned_long> OVar16;
  undefined1 local_168 [8];
  Expected<llvm::DWARFDebugRnglistTable> TableOrError;
  DWARFDataExtractor RangesDA;
  SmallString<16U> AbsolutePath;
  DWARFDie UnitDie;
  void *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Child local_50;
  shared_ptr<llvm::DWARFContext> DWOContext;
  ulong local_38;
  
  if ((this->IsDWO == false) &&
     ((this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    extractDIEsIfNeeded(this,true);
    UnitDie.U = (DWARFUnit *)
                (this->DieArray).
                super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = (DWARFUnit *)0x0;
    AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ =
         this;
    if (UnitDie.U ==
        (DWARFUnit *)
        (this->DieArray).
        super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      UnitDie.U = pDVar13;
      AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_
           = pDVar13;
    }
    if (UnitDie.U == (DWARFUnit *)0x0) goto LAB_00d7918d;
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_168,
                   (DWARFDie *)
                   (AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts + 8),DW_AT_GNU_dwo_name);
    if (TableOrError.field_0.TStorage.buffer[0x28] != '\0') {
      OVar14 = DWARFFormValue::getAsCString((DWARFFormValue *)local_168);
      if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_168,
                       (DWARFDie *)
                       (AbsolutePath.super_SmallVector<char,_16U>.
                        super_SmallVectorStorage<char,_16U>.InlineElts + 8),DW_AT_comp_dir);
        if (TableOrError.field_0.TStorage.buffer[0x28] == '\x01') {
          OVar15 = DWARFFormValue::getAsCString((DWARFFormValue *)local_168);
          Str = OVar15.Storage.field_0;
          bVar11 = OVar15.Storage.hasVal;
        }
        else {
          bVar11 = 0;
          Str.value = (char *)0x0;
        }
        puVar2 = &AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                  super_SmallVectorTemplateBase<char,_true>.
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        AbsolutePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
        super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
        super_SmallVectorBase.BeginX = (void *)0x1000000000;
        RangesDA.Section = (DWARFSection *)puVar2;
        Twine::Twine((Twine *)local_168,OVar14.Storage.field_0.value);
        bVar6 = sys::path::is_relative((Twine *)local_168,native);
        if (((bVar6 & bVar11) == 1) && (Str.value != (char *)0x0)) {
          Twine::Twine((Twine *)local_168,Str.value);
          Twine::Twine((Twine *)&TableOrError.field_0x98,"");
          Twine::Twine((Twine *)&UnitDie.Die,"");
          Twine::Twine((Twine *)&local_50,"");
          sys::path::append((SmallVectorImpl<char> *)&RangesDA.Section,(Twine *)local_168,
                            (Twine *)&TableOrError.field_0x98,(Twine *)&UnitDie.Die,
                            (Twine *)&local_50);
        }
        Twine::Twine((Twine *)local_168,OVar14.Storage.field_0.value);
        Twine::Twine((Twine *)&TableOrError.field_0x98,"");
        Twine::Twine((Twine *)&UnitDie.Die,"");
        Twine::Twine((Twine *)&local_50,"");
        sys::path::append((SmallVectorImpl<char> *)&RangesDA.Section,(Twine *)local_168,
                          (Twine *)&TableOrError.field_0x98,(Twine *)&UnitDie.Die,(Twine *)&local_50
                         );
        extractDIEsIfNeeded(this,true);
        if (((this->Header).DWOId.Storage.hasVal & 1U) == 0) {
          pDVar13 = (DWARFUnit *)0x0;
        }
        else {
          uVar10 = (this->Header).DWOId.Storage.field_0.value;
          AbsolutePath_00.Length = (size_t)RangesDA.Section;
          AbsolutePath_00.Data = (char *)this->Context;
          DWARFContext::getDWOContext((DWARFContext *)&local_50,AbsolutePath_00);
          if (((DWARFContext *)local_50.twine == (DWARFContext *)0x0) ||
             (peVar8 = &DWARFContext::getDWOCompileUnitForHash
                                  ((DWARFContext *)local_50.twine,uVar10)->super_DWARFUnit,
             peVar8 == (element_type *)0x0)) {
            pDVar13 = (DWARFUnit *)0x0;
          }
          else {
            if (DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pDVar1 = &((DWOContext.
                            super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_DIContext).Kind;
                *pDVar1 = *pDVar1 + CK_PDB;
                UNLOCK();
              }
              else {
                pDVar1 = &((DWOContext.
                            super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_DIContext).Kind;
                *pDVar1 = *pDVar1 + CK_PDB;
              }
            }
            (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar8;
            this_00 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              peVar8 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            }
            uVar4 = this->AddrOffsetSectionBase;
            peVar8->AddrOffsetSection = this->AddrOffsetSection;
            peVar8->AddrOffsetSectionBase = uVar4;
            if ((this->Header).FormParams.Version < 5) {
              OVar16 = DWARFDie::getRangesBaseAttribute
                                 ((DWARFDie *)
                                  (AbsolutePath.super_SmallVector<char,_16U>.
                                   super_SmallVectorStorage<char,_16U>.InlineElts + 8));
              aVar12.value = 0;
              if (((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) {
                aVar12.value = OVar16.Storage.field_0.value;
              }
              peVar8 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              peVar8->RangeSection = this->RangeSection;
              peVar8->RangeSectionBase = (uint64_t)aVar12;
            }
            else {
              iVar7 = (*((this->Context->DObj)._M_t.
                         super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                         .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                        _vptr_DWARFObject[0x22])();
              peVar8->RangeSection = (DWARFSection *)CONCAT44(extraout_var,iVar7);
              peVar8->RangeSectionBase = 0;
              RangesDA.Obj = (DWARFObject *)this->RangeSection;
              RangesDA.super_DataExtractor._16_8_ =
                   (this->Context->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
              RangesDA.super_DataExtractor.Data.Length._0_1_ = this->isLittleEndian;
              TableOrError._152_8_ = ((StringRef *)&(RangesDA.Obj)->_vptr_DWARFObject)->Data;
              RangesDA.super_DataExtractor.Data.Data = ((RangesDA.Obj)->Dummy).Data.Data;
              RangesDA.super_DataExtractor.Data.Length._1_1_ = 0;
              Format = (this->Header).FormParams.Format;
              __n_00 = (size_t)Format;
              parseRngListTableHeader
                        ((Expected<llvm::DWARFDebugRnglistTable> *)local_168,
                         (DWARFDataExtractor *)&TableOrError.field_0x98,this->RangeSectionBase,
                         Format);
              if ((TableOrError.field_0.TStorage.buffer[0x90] & 1U) == 0) {
                optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
                          (&(((this->DWO).
                              super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->RngListTable).Storage,(DWARFDebugRnglistTable *)local_168);
              }
              else {
                prVar9 = WithColor::error();
                Str_00.Length = 0x1c;
                Str_00.Data = "parsing a range list table: ";
                prVar9 = raw_ostream::operator<<(prVar9,Str_00);
                auVar5 = local_168;
                local_38 = 1;
                if ((TableOrError.field_0.TStorage.buffer[0x90] & 1U) != 0) {
                  local_168[0] = '\0';
                  local_168[1] = '\0';
                  local_168[2] = '\0';
                  local_168[3] = '\0';
                  local_168[4] = '\0';
                  local_168[5] = '\0';
                  local_168[6] = '\0';
                  local_168[7] = '\0';
                  local_38 = (ulong)auVar5 | 1;
                }
                toString_abi_cxx11_((string *)&UnitDie.Die,(llvm *)&local_38,E);
                prVar9 = (raw_ostream *)raw_ostream::write(prVar9,(int)UnitDie.Die,local_68,__n_00);
                __n = prVar9->OutBufCur;
                if (__n < prVar9->OutBufEnd) {
                  prVar9->OutBufCur = __n + 1;
                  *__n = '\n';
                }
                else {
                  raw_ostream::write(prVar9,10,__buf,(size_t)__n);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)UnitDie.Die != &local_60) {
                  operator_delete(UnitDie.Die,local_60._M_allocated_capacity + 1);
                }
                if ((long *)(local_38 & 0xfffffffffffffffe) != (long *)0x0) {
                  (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
                }
              }
              Expected<llvm::DWARFDebugRnglistTable>::~Expected
                        ((Expected<llvm::DWARFDebugRnglistTable> *)local_168);
              peVar8 = (this->DWO).super___shared_ptr<llvm::DWARFUnit,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((peVar8->RngListTable).Storage.hasVal == true) {
                cVar3 = *(char *)((long)&(peVar8->RngListTable).Storage.field_0 + 0x28);
                uVar10 = 0xc;
                if (cVar3 != '\0') {
                  if (cVar3 != '\x01') {
                    llvm_unreachable_internal
                              ("Invalid DWARF format (expected DWARF32 or DWARF64",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                               ,0x73);
                  }
                  uVar10 = 0x14;
                }
                peVar8->RangeSectionBase = uVar10;
              }
            }
            pDVar13 = (DWARFUnit *)0x1;
          }
          if (DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       DWOContext.super___shared_ptr<llvm::DWARFContext,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
        }
        if (RangesDA.Section != (DWARFSection *)puVar2) {
          free(RangesDA.Section);
        }
        goto LAB_00d7918d;
      }
    }
  }
  pDVar13 = (DWARFUnit *)0x0;
LAB_00d7918d:
  return SUB81(pDVar13,0);
}

Assistant:

bool DWARFUnit::parseDWO() {
  if (IsDWO)
    return false;
  if (DWO.get())
    return false;
  DWARFDie UnitDie = getUnitDIE();
  if (!UnitDie)
    return false;
  auto DWOFileName = dwarf::toString(UnitDie.find(DW_AT_GNU_dwo_name));
  if (!DWOFileName)
    return false;
  auto CompilationDir = dwarf::toString(UnitDie.find(DW_AT_comp_dir));
  SmallString<16> AbsolutePath;
  if (sys::path::is_relative(*DWOFileName) && CompilationDir &&
      *CompilationDir) {
    sys::path::append(AbsolutePath, *CompilationDir);
  }
  sys::path::append(AbsolutePath, *DWOFileName);
  auto DWOId = getDWOId();
  if (!DWOId)
    return false;
  auto DWOContext = Context.getDWOContext(AbsolutePath);
  if (!DWOContext)
    return false;

  DWARFCompileUnit *DWOCU = DWOContext->getDWOCompileUnitForHash(*DWOId);
  if (!DWOCU)
    return false;
  DWO = std::shared_ptr<DWARFCompileUnit>(std::move(DWOContext), DWOCU);
  // Share .debug_addr and .debug_ranges section with compile unit in .dwo
  DWO->setAddrOffsetSection(AddrOffsetSection, AddrOffsetSectionBase);
  if (getVersion() >= 5) {
    DWO->setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                isLittleEndian, 0);
    if (auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                    Header.getFormat()))
      DWO->RngListTable = TableOrError.get();
    else
      WithColor::error() << "parsing a range list table: "
                         << toString(TableOrError.takeError())
                         << '\n';
    if (DWO->RngListTable)
      DWO->RangeSectionBase = DWO->RngListTable->getHeaderSize();
  } else {
    auto DWORangesBase = UnitDie.getRangesBaseAttribute();
    DWO->setRangesSection(RangeSection, DWORangesBase ? *DWORangesBase : 0);
  }

  return true;
}